

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uni_log.c
# Opt level: O0

int LogWrite(LogLevel level,char *tags,char *function,int line,char *fmt,...)

{
  char in_AL;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [40];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined1 local_48 [8];
  va_list args;
  char *fmt_local;
  int line_local;
  char *function_local;
  char *tags_local;
  LogLevel level_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_d0 = in_R9;
  args[0].reg_save_area = fmt;
  _lazy_init();
  args[0].overflow_arg_area = local_f8;
  args[0]._0_8_ = &stack0x00000008;
  local_48._4_4_ = 0x30;
  local_48._0_4_ = 0x28;
  _sync_write_process(level,tags,function,line,(char *)args[0].reg_save_area,
                      (__va_list_tag *)local_48);
  return 0;
}

Assistant:

int LogWrite(LogLevel level, const char *tags, const char *function, int line,
             char *fmt, ...) {
  va_list args;
  _lazy_init();
  va_start(args, fmt);
  _sync_write_process(level, tags, function, line, fmt, args);
  va_end(args);
  return 0;
}